

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

void nullcSetEnableLogFiles
               (int enable,_func_void_ptr_char_ptr *openStream,
               _func_void_void_ptr_char_ptr_uint *writeStream,_func_void_void_ptr *closeStream)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  code *pcVar4;
  code *pcVar5;
  code *pcVar6;
  
  NULLC::enableLogFiles = enable != 0;
  bVar2 = openStream != (_func_void_ptr_char_ptr *)0x0;
  bVar3 = writeStream != (_func_void_void_ptr_char_ptr_uint *)0x0;
  bVar1 = closeStream != (_func_void_void_ptr *)0x0;
  pcVar4 = OutputContext::FileOpen;
  if ((bVar2 || bVar3) || bVar1) {
    pcVar4 = openStream;
  }
  pcVar6 = OutputContext::FileWrite;
  if ((bVar2 || bVar3) || bVar1) {
    pcVar6 = writeStream;
  }
  pcVar5 = OutputContext::FileClose;
  if ((bVar2 || bVar3) || bVar1) {
    pcVar5 = closeStream;
  }
  NULLC::openStream = pcVar4;
  NULLC::writeStream = pcVar6;
  NULLC::closeStream = pcVar5;
  return;
}

Assistant:

void nullcSetEnableLogFiles(int enable, void* (*openStream)(const char* name), void (*writeStream)(void *stream, const char *data, unsigned size), void (*closeStream)(void* stream))
{
	NULLC::enableLogFiles = enable != 0;

	if(openStream || writeStream || closeStream)
	{
		NULLC::openStream = openStream;
		NULLC::writeStream = writeStream;
		NULLC::closeStream = closeStream;
	}
	else
	{
		NULLC::openStream = OutputContext::FileOpen;
		NULLC::writeStream = OutputContext::FileWrite;
		NULLC::closeStream = OutputContext::FileClose;
	}
}